

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O3

double * __thiscall ON_4dPoint::operator[](ON_4dPoint *this,uint i)

{
  if (i != 0) {
    if (2 < i) {
      return &this->w;
    }
    this = (ON_4dPoint *)(&this->y + (i != 1));
  }
  return &this->x;
}

Assistant:

double& ON_4dPoint::operator[](unsigned int i)
{
  double* pd = (i<=0) ? &x : ( (i>=3) ? &w : (i==1)?&y:&z);
  return *pd;
}